

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O3

sds sdsRemoveFreeSpace(sds s)

{
  byte bVar1;
  void *pvVar2;
  byte bVar3;
  size_t __size;
  ulong uVar4;
  long lVar5;
  sds pcVar6;
  long lVar7;
  
  bVar3 = s[-1];
  switch(bVar3 & 7) {
  case 0:
    uVar4 = (ulong)(bVar3 >> 3);
    break;
  case 1:
    uVar4 = (ulong)(byte)s[-3];
    break;
  case 2:
    uVar4 = (ulong)*(ushort *)(s + -5);
    break;
  case 3:
    uVar4 = (ulong)*(uint *)(s + -9);
    break;
  case 4:
    uVar4 = *(ulong *)(s + -0x11);
    break;
  default:
    uVar4 = 0;
  }
  bVar1 = (byte)(bVar3 & 7);
  if (bVar1 < 5) {
    lVar7 = *(long *)(&UINT_0010c0f0 + (ulong)(bVar3 & 7) * 2);
  }
  else {
    lVar7 = 0;
  }
  if (uVar4 < 0x20) {
    lVar5 = 1;
    bVar3 = 0;
  }
  else if (uVar4 < 0xff) {
    lVar5 = 3;
    bVar3 = 1;
  }
  else if (uVar4 < 0xffff) {
    lVar5 = 5;
    bVar3 = 2;
  }
  else {
    bVar3 = 4 - (uVar4 < 0xffffffff);
    lVar5 = (ulong)(0xfffffffe < uVar4) * 8 + 9;
  }
  __size = uVar4 + lVar5 + 1;
  if (bVar1 == bVar3) {
    pvVar2 = realloc(s + lVar7,__size);
    if (pvVar2 != (void *)0x0) {
      pcVar6 = (sds)((long)pvVar2 + lVar5);
      switch(*(byte *)((long)pvVar2 + lVar5 + -1) & 7) {
      case 1:
        pcVar6[-2] = (char)uVar4;
        return pcVar6;
      case 2:
        *(short *)(pcVar6 + -3) = (short)uVar4;
        return pcVar6;
      case 3:
        *(int *)(pcVar6 + -5) = (int)uVar4;
        return pcVar6;
      case 4:
        *(ulong *)(pcVar6 + -9) = uVar4;
        return pcVar6;
      default:
        return pcVar6;
      }
    }
  }
  else {
    pvVar2 = malloc(__size);
    if (pvVar2 != (void *)0x0) {
      memcpy((void *)((long)pvVar2 + lVar5),s,uVar4 + 1);
      free(s + lVar7);
      *(byte *)((long)pvVar2 + lVar5 + -1) = bVar3;
      pcVar6 = (sds)(*(code *)((long)&UINT_0010bdd0 + (long)(int)(&UINT_0010bdd0)[bVar3]))();
      return pcVar6;
    }
  }
  return (sds)0x0;
}

Assistant:

sds sdsRemoveFreeSpace(sds s) {
    void *sh, *newsh;
    char type, oldtype = s[-1] & SDS_TYPE_MASK;
    int hdrlen;
    size_t len = sdslen(s);
    sh = (char*)s-sdsHdrSize(oldtype);

    type = sdsReqType(len);
    hdrlen = sdsHdrSize(type);
    if (oldtype==type) {
        newsh = s_realloc(sh, hdrlen+len+1);
        if (newsh == NULL) return NULL;
        s = (char*)newsh+hdrlen;
    } else {
        newsh = s_malloc(hdrlen+len+1);
        if (newsh == NULL) return NULL;
        memcpy((char*)newsh+hdrlen, s, len+1);
        s_free(sh);
        s = (char*)newsh+hdrlen;
        s[-1] = type;
        sdssetlen(s, len);
    }
    sdssetalloc(s, len);
    return s;
}